

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::OnLoop(TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  Result RVar1;
  TypeVector *result_types_local;
  TypeVector *param_types_local;
  TypeChecker *this_local;
  Result result;
  
  RVar1 = PopAndCheckSignature(this,param_types,"loop");
  PushLabel(this,Loop,param_types,result_types);
  PushTypes(this,param_types);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::OnLoop(const TypeVector& param_types,
                           const TypeVector& result_types) {
  Result result = PopAndCheckSignature(param_types, "loop");
  PushLabel(LabelType::Loop, param_types, result_types);
  PushTypes(param_types);
  return result;
}